

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O0

int X509_NAME_ENTRY_set_object(X509_NAME_ENTRY *ne,ASN1_OBJECT *obj)

{
  ASN1_OBJECT *pAVar1;
  ASN1_OBJECT *obj_local;
  X509_NAME_ENTRY *ne_local;
  
  if ((ne == (X509_NAME_ENTRY *)0x0) || (obj == (ASN1_OBJECT *)0x0)) {
    ERR_put_error(0xb,0,0x43,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509name.cc"
                  ,0x142);
    ne_local._4_4_ = 0;
  }
  else {
    ASN1_OBJECT_free(ne->object);
    pAVar1 = OBJ_dup(obj);
    ne->object = pAVar1;
    ne_local._4_4_ = (uint)(ne->object != (ASN1_OBJECT *)0x0);
  }
  return ne_local._4_4_;
}

Assistant:

int X509_NAME_ENTRY_set_object(X509_NAME_ENTRY *ne, const ASN1_OBJECT *obj) {
  if ((ne == NULL) || (obj == NULL)) {
    OPENSSL_PUT_ERROR(X509, ERR_R_PASSED_NULL_PARAMETER);
    return 0;
  }
  ASN1_OBJECT_free(ne->object);
  ne->object = OBJ_dup(obj);
  return ((ne->object == NULL) ? 0 : 1);
}